

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::shape(Mat *this)

{
  Mat *in_RSI;
  Mat *in_RDI;
  Allocator *unaff_retaddr;
  size_t in_stack_ffffffffffffffd0;
  
  if (in_RSI->dims == 1) {
    Mat(in_RDI,in_RSI->w * in_RSI->elempack,(void *)0x0,4,(Allocator *)0x0);
  }
  else if (in_RSI->dims == 2) {
    Mat(in_RDI,in_RSI->w,in_RSI->h * in_RSI->elempack,(void *)0x0,4,(Allocator *)0x0);
  }
  else if (in_RSI->dims == 3) {
    Mat(in_RSI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)in_RDI >> 0x20),in_RDI,
        in_stack_ffffffffffffffd0,unaff_retaddr);
  }
  else {
    Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

inline Mat Mat::shape() const
{
    if (dims == 1)
        return Mat(w * elempack, (void*)0);
    if (dims == 2)
        return Mat(w, h * elempack, (void*)0);
    if (dims == 3)
        return Mat(w, h, c * elempack, (void*)0);

    return Mat();
}